

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O0

char * monster_test_local_MyGame_Example_json_parser_enum
                 (flatcc_json_parser_t *ctx,char *buf,char *end,int *value_type,uint64_t *value,
                 int *aggregate)

{
  uint64_t uVar1;
  char *pcVar2;
  char *buf_00;
  uint64_t w;
  char *mark;
  char *unmatched;
  int *aggregate_local;
  uint64_t *value_local;
  int *value_type_local;
  char *end_local;
  char *buf_local;
  flatcc_json_parser_t *ctx_local;
  
  uVar1 = flatcc_json_parser_symbol_part(buf,end);
  if (uVar1 < 0x6865785f656e756d) {
    if (uVar1 < 0x436f6c6f72000000) {
      if ((uVar1 & 0xffffff0000000000) != 0x416e790000000000) {
        return buf;
      }
      pcVar2 = flatcc_json_parser_match_scope(ctx,buf,end,3);
      if (pcVar2 == buf) {
        return buf;
      }
      end_local = MyGame_Example_Any_parse_json_enum(ctx,pcVar2,end,value_type,value,aggregate);
    }
    else if ((uVar1 & 0xffffff0000000000) == 0x466f6f0000000000) {
      pcVar2 = flatcc_json_parser_match_scope(ctx,buf,end,3);
      if (pcVar2 == buf) {
        return buf;
      }
      end_local = MyGame_Example_Foo_parse_json_enum(ctx,pcVar2,end,value_type,value,aggregate);
    }
    else {
      if ((uVar1 & 0xffffffffff000000) != 0x436f6c6f72000000) {
        return buf;
      }
      pcVar2 = flatcc_json_parser_match_scope(ctx,buf,end,5);
      if (pcVar2 == buf) {
        return buf;
      }
      end_local = MyGame_Example_Color_parse_json_enum(ctx,pcVar2,end,value_type,value,aggregate);
    }
  }
  else if (uVar1 < 0x696e745f656e756d) {
    if (uVar1 != 0x6865785f656e756d) {
      return buf;
    }
    pcVar2 = flatcc_json_parser_match_scope(ctx,buf,end,8);
    if (pcVar2 == buf) {
      return buf;
    }
    end_local = MyGame_Example_hex_enum_parse_json_enum(ctx,pcVar2,end,value_type,value,aggregate);
  }
  else if (uVar1 < 0x6e65675f656e756d) {
    if (uVar1 != 0x696e745f656e756d) {
      return buf;
    }
    pcVar2 = flatcc_json_parser_match_scope(ctx,buf,end,8);
    if (pcVar2 == buf) {
      return buf;
    }
    end_local = MyGame_Example_int_enum_parse_json_enum(ctx,pcVar2,end,value_type,value,aggregate);
  }
  else {
    end_local = buf;
    if ((uVar1 == 0x6e65675f656e756d) &&
       (end_local = flatcc_json_parser_match_scope(ctx,buf,end,8), end_local != buf)) {
      end_local = MyGame_Example_neg_enum_parse_json_enum
                            (ctx,end_local,end,value_type,value,aggregate);
    }
    else {
      if (uVar1 != 0x6e6f74656d707479) {
        return buf;
      }
      pcVar2 = end_local + 8;
      uVar1 = flatcc_json_parser_symbol_part(pcVar2,end);
      if ((uVar1 & 0xffffffff00000000) != 0x656e756d00000000) {
        return buf;
      }
      buf_00 = flatcc_json_parser_match_scope(ctx,pcVar2,end,4);
      if (buf_00 == pcVar2) {
        return buf;
      }
      end_local = MyGame_Example_notemptyenum_parse_json_enum
                            (ctx,buf_00,end,value_type,value,aggregate);
    }
  }
  return end_local;
}

Assistant:

static const char *monster_test_local_MyGame_Example_json_parser_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,
        int *value_type, uint64_t *value, int *aggregate)
{
    const char *unmatched = buf;
    const char *mark;
    uint64_t w;

    w = flatcc_json_parser_symbol_part(buf, end);
    if (w < 0x6865785f656e756d) { /* branch "hex_enum" */
        if (w < 0x436f6c6f72000000) { /* branch "Color" */
            if ((w & 0xffffff0000000000) == 0x416e790000000000) { /* "Any" */
                buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 3);
                if (buf != mark) {
                    buf = MyGame_Example_Any_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                } else {
                    return unmatched;
                }
            } else { /* "Any" */
                return unmatched;
            } /* "Any" */
        } else { /* branch "Color" */
            if ((w & 0xffffff0000000000) == 0x466f6f0000000000) { /* "Foo" */
                buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 3);
                if (buf != mark) {
                    buf = MyGame_Example_Foo_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                } else {
                    return unmatched;
                }
            } else { /* "Foo" */
                if ((w & 0xffffffffff000000) == 0x436f6c6f72000000) { /* "Color" */
                    buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 5);
                    if (buf != mark) {
                        buf = MyGame_Example_Color_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                    } else {
                        return unmatched;
                    }
                } else { /* "Color" */
                    return unmatched;
                } /* "Color" */
            } /* "Foo" */
        } /* branch "Color" */
    } else { /* branch "hex_enum" */
        if (w < 0x696e745f656e756d) { /* branch "int_enum" */
            if (w == 0x6865785f656e756d) { /* "hex_enum" */
                buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 8);
                if (buf != mark) {
                    buf = MyGame_Example_hex_enum_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                } else {
                    return unmatched;
                }
            } else { /* "hex_enum" */
                return unmatched;
            } /* "hex_enum" */
        } else { /* branch "int_enum" */
            if (w < 0x6e65675f656e756d) { /* branch "neg_enum" */
                if (w == 0x696e745f656e756d) { /* "int_enum" */
                    buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 8);
                    if (buf != mark) {
                        buf = MyGame_Example_int_enum_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                    } else {
                        return unmatched;
                    }
                } else { /* "int_enum" */
                    return unmatched;
                } /* "int_enum" */
            } else { /* branch "neg_enum" */
                if (w == 0x6e65675f656e756d) { /* "neg_enum" */
                    buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 8);
                    if (buf != mark) {
                        buf = MyGame_Example_neg_enum_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                    } else {
                        goto pfguard1;
                    }
                } else { /* "neg_enum" */
                    goto pfguard1;
                } /* "neg_enum" */
                goto endpfguard1;
pfguard1:
                if (w == 0x6e6f74656d707479) { /* descend "notempty" */
                    buf += 8;
                    w = flatcc_json_parser_symbol_part(buf, end);
                    if ((w & 0xffffffff00000000) == 0x656e756d00000000) { /* "enum" */
                        buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 4);
                        if (buf != mark) {
                            buf = MyGame_Example_notemptyenum_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                        } else {
                            return unmatched;
                        }
                    } else { /* "enum" */
                        return unmatched;
                    } /* "enum" */
                } else { /* descend "notempty" */
                    return unmatched;
                } /* descend "notempty" */
endpfguard1:
                (void)0;
            } /* branch "neg_enum" */
        } /* branch "int_enum" */
    } /* branch "hex_enum" */
    return buf;
}